

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O0

bool __thiscall GF2::MM<45UL>::IsDivisibleBy(MM<45UL> *this,MM<45UL> *mRight)

{
  bool bVar1;
  word wVar2;
  WW<45UL> *in_RSI;
  ulong *in_RDI;
  size_t pos;
  
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return true;
    }
    wVar2 = WW<45UL>::GetWord(in_RSI,0);
    if ((wVar2 & (*in_RDI ^ 0xffffffffffffffff)) != 0) break;
    bVar1 = true;
  }
  return false;
}

Assistant:

bool IsDivisibleBy(const MM& mRight) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if (mRight.GetWord(pos) & ~_words[pos])
				return false;
		return true;
	}